

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

reference __thiscall
wabt::CircularArray<wabt::Token,_2UL>::back(CircularArray<wabt::Token,_2UL> *this)

{
  reference pvVar1;
  
  pvVar1 = at(this,this->size_ - 1);
  return pvVar1;
}

Assistant:

reference back() { return at(size_ - 1); }